

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int pmain(lua_State *L)

{
  int iVar1;
  uint local_30;
  int local_2c;
  int flags;
  int argn;
  char **argv;
  Smain *s;
  lua_State *L_local;
  
  argv = (char **)&smain;
  _flags = smain.argv;
  local_30 = 0;
  globalL = L;
  s = (Smain *)L;
  luaJIT_version_2_1_1741897244();
  local_2c = collectargs(_flags,(int *)&local_30);
  if (local_2c < 0) {
    print_usage();
    *(undefined4 *)((long)argv + 0xc) = 1;
  }
  else {
    if ((local_30 & 0x10) != 0) {
      lua_pushboolean((lua_State *)s,1);
      lua_setfield((lua_State *)s,-10000,"LUA_NOENV");
    }
    lua_gc((lua_State *)s,0,0);
    luaL_openlibs((lua_State *)s);
    lua_gc((lua_State *)s,1,-1);
    createargtable((lua_State *)s,_flags,*(int *)(argv + 1),local_2c);
    if ((local_30 & 0x10) == 0) {
      iVar1 = handle_luainit((lua_State *)s);
      *(int *)((long)argv + 0xc) = iVar1;
      if (*(int *)((long)argv + 0xc) != 0) {
        return 0;
      }
    }
    if ((local_30 & 2) != 0) {
      print_version();
    }
    iVar1 = runargs((lua_State *)s,_flags,local_2c);
    *(int *)((long)argv + 0xc) = iVar1;
    if (*(int *)((long)argv + 0xc) == 0) {
      if (local_2c < *(int *)(argv + 1)) {
        iVar1 = handle_script((lua_State *)s,_flags + local_2c);
        *(int *)((long)argv + 0xc) = iVar1;
        if (*(int *)((long)argv + 0xc) != 0) {
          return 0;
        }
      }
      if ((local_30 & 1) == 0) {
        if ((*(int *)(argv + 1) == local_2c) && ((local_30 & 6) == 0)) {
          iVar1 = isatty(0);
          if (iVar1 == 0) {
            dofile((lua_State *)s,(char *)0x0);
          }
          else {
            print_version();
            print_jit_status((lua_State *)s);
            dotty((lua_State *)s);
          }
        }
      }
      else {
        print_jit_status((lua_State *)s);
        dotty((lua_State *)s);
      }
    }
  }
  return 0;
}

Assistant:

static int pmain(lua_State *L)
{
  struct Smain *s = &smain;
  char **argv = s->argv;
  int argn;
  int flags = 0;
  globalL = L;
  LUAJIT_VERSION_SYM();  /* Linker-enforced version check. */

  argn = collectargs(argv, &flags);
  if (argn < 0) {  /* Invalid args? */
    print_usage();
    s->status = 1;
    return 0;
  }

  if ((flags & FLAGS_NOENV)) {
    lua_pushboolean(L, 1);
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }

  /* Stop collector during library initialization. */
  lua_gc(L, LUA_GCSTOP, 0);
  luaL_openlibs(L);
  lua_gc(L, LUA_GCRESTART, -1);

  createargtable(L, argv, s->argc, argn);

  if (!(flags & FLAGS_NOENV)) {
    s->status = handle_luainit(L);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_VERSION)) print_version();

  s->status = runargs(L, argv, argn);
  if (s->status != LUA_OK) return 0;

  if (s->argc > argn) {
    s->status = handle_script(L, argv + argn);
    if (s->status != LUA_OK) return 0;
  }

  if ((flags & FLAGS_INTERACTIVE)) {
    print_jit_status(L);
    dotty(L);
  } else if (s->argc == argn && !(flags & (FLAGS_EXEC|FLAGS_VERSION))) {
    if (lua_stdin_is_tty()) {
      print_version();
      print_jit_status(L);
      dotty(L);
    } else {
      dofile(L, NULL);  /* Executes stdin as a file. */
    }
  }
  return 0;
}